

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_writer.cc
# Opt level: O2

Status __thiscall
leveldb::log::Writer::EmitPhysicalRecord(Writer *this,RecordType t,char *ptr,size_t length)

{
  long lVar1;
  WritableFile *pWVar2;
  uint __line;
  uint32_t uVar3;
  undefined4 in_register_00000034;
  undefined8 *puVar4;
  char *__assertion;
  ulong in_R8;
  long in_FS_OFFSET;
  Status local_50;
  Status local_48;
  ulong local_40;
  char buf [7];
  
  puVar4 = (undefined8 *)CONCAT44(in_register_00000034,t);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_R8 < 0x10000) {
    if ((long)*(int *)(puVar4 + 1) + in_R8 + 7 < 0x8001) {
      buf[4] = (char)in_R8;
      buf[5] = (char)(in_R8 >> 8);
      buf[6] = (char)ptr;
      uVar3 = crc32c::Extend(*(uint32_t *)((long)puVar4 + ((ulong)ptr & 0xffffffff) * 4 + 0xc),
                             (char *)length,in_R8);
      EncodeFixed32(buf,(uVar3 << 0x11 | uVar3 >> 0xf) + 0xa282ead8);
      local_40 = 7;
      local_48.state_ = (char *)buf;
      (**(code **)(*(long *)*puVar4 + 0x10))(this);
      if (this->dest_ == (WritableFile *)0x0) {
        local_48.state_ = (char *)length;
        local_40 = in_R8;
        (**(code **)(*(long *)*puVar4 + 0x10))(&local_50);
        pWVar2 = this->dest_;
        this->dest_ = (WritableFile *)local_50.state_;
        local_50.state_ = (char *)pWVar2;
        Status::~Status(&local_50);
        if (this->dest_ == (WritableFile *)0x0) {
          (**(code **)(*(long *)*puVar4 + 0x20))(&local_48);
          pWVar2 = this->dest_;
          this->dest_ = (WritableFile *)local_48.state_;
          local_48.state_ = (char *)pWVar2;
          Status::~Status(&local_48);
        }
      }
      *(int *)(puVar4 + 1) = *(int *)(puVar4 + 1) + (int)in_R8 + 7;
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return (Status)(char *)this;
      }
      __stack_chk_fail();
    }
    __assertion = "block_offset_ + kHeaderSize + length <= kBlockSize";
    __line = 0x55;
  }
  else {
    __assertion = "length <= 0xffff";
    __line = 0x54;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/db/log_writer.cc"
                ,__line,
                "Status leveldb::log::Writer::EmitPhysicalRecord(RecordType, const char *, size_t)")
  ;
}

Assistant:

Status Writer::EmitPhysicalRecord(RecordType t, const char* ptr,
                                  size_t length) {
  assert(length <= 0xffff);  // Must fit in two bytes
  assert(block_offset_ + kHeaderSize + length <= kBlockSize);

  // Format the header
  char buf[kHeaderSize];
  buf[4] = static_cast<char>(length & 0xff);
  buf[5] = static_cast<char>(length >> 8);
  buf[6] = static_cast<char>(t);

  // Compute the crc of the record type and the payload.
  uint32_t crc = crc32c::Extend(type_crc_[t], ptr, length);
  crc = crc32c::Mask(crc);  // Adjust for storage
  EncodeFixed32(buf, crc);

  // Write the header and the payload
  Status s = dest_->Append(Slice(buf, kHeaderSize));
  if (s.ok()) {
    s = dest_->Append(Slice(ptr, length));
    if (s.ok()) {
      s = dest_->Flush();
    }
  }
  block_offset_ += kHeaderSize + length;
  return s;
}